

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O1

void sort_rec3(float *array,int *perm,int size)

{
  float fVar1;
  float fVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  for (; 0xf < size; size = (size - iVar12) - (int)lVar11) {
    fVar1 = array[(uint)size >> 1];
    lVar13 = -1;
    uVar4 = (ulong)(uint)size;
    while( true ) {
      iVar12 = (int)lVar13;
      lVar5 = (long)iVar12;
      lVar11 = 0;
      lVar7 = 0;
      do {
        fVar2 = array[lVar5 + lVar11 + 1];
        lVar7 = lVar7 + -4;
        lVar11 = lVar11 + 1;
      } while (fVar2 < fVar1);
      uVar4 = (ulong)(int)uVar4;
      lVar13 = lVar5 + lVar11;
      do {
        lVar3 = uVar4 - 1;
        uVar4 = uVar4 - 1;
      } while (fVar1 < array[lVar3]);
      if ((long)uVar4 <= lVar13) break;
      array[lVar5 + lVar11] = array[lVar3];
      array[uVar4] = fVar2;
      iVar12 = perm[lVar5 + lVar11];
      perm[lVar5 + lVar11] = perm[uVar4];
      perm[uVar4] = iVar12;
    }
    sort_rec3(array,perm,(int)lVar11 + iVar12);
    perm = (int *)((long)perm + ((long)iVar12 * 4 - lVar7));
    array = (float *)((long)array + ((long)iVar12 * 4 - lVar7));
  }
  if (1 < size) {
    uVar6 = 1;
    uVar4 = 0;
    do {
      uVar10 = uVar4 & 0xffffffff;
      uVar8 = uVar6;
      do {
        uVar9 = (uint)uVar8;
        if (array[(int)(uint)uVar10] < array[uVar8] || array[(int)(uint)uVar10] == array[uVar8]) {
          uVar9 = (uint)uVar10;
        }
        uVar8 = uVar8 + 1;
        uVar10 = (ulong)uVar9;
      } while ((uint)size != uVar8);
      fVar1 = array[uVar4];
      array[uVar4] = array[(int)uVar9];
      array[(int)uVar9] = fVar1;
      iVar12 = perm[uVar4];
      perm[uVar4] = perm[(int)uVar9];
      uVar4 = uVar4 + 1;
      perm[(int)uVar9] = iVar12;
      uVar6 = uVar6 + 1;
    } while (uVar4 != size - 1);
  }
  return;
}

Assistant:

static void sort_rec3(float* array, int* perm, int size)
{
    if (size <= 15)
        selectionsort3(array, perm, size);
    else{
        float  pivot = array[size/2];
        float  tmpf;
        int    tmpi;
        int    i = -1;
        int    j = size;
        for(;;){
            do i++; while(array[i] < pivot);
            do j--; while(pivot < array[j]);
            if (i >= j) break;
            tmpf = array[i]; array[i] = array[j]; array[j] = tmpf;
            tmpi = perm[i];  perm[i]  = perm[j];  perm[j]  = tmpi;
        }
        sort_rec3(array    , perm,     i     );
        sort_rec3(&array[i], &perm[i], size-i);
    }
}